

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_partial_sign
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,
              secp256k1_aggsig_partial_signature *partial,uchar *msghash32,uchar *seckey32,
              size_t index)

{
  int iVar1;
  long in_RCX;
  uchar *in_RDX;
  long *in_RSI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  uchar prehash [32];
  int overflow;
  secp256k1_ge tmp_ge;
  secp256k1_scalar sec;
  secp256k1_scalar sighash;
  size_t i;
  secp256k1_ge *in_stack_fffffffffffffef8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  secp256k1_scalar *in_stack_ffffffffffffff08;
  secp256k1_scalar *in_stack_ffffffffffffff10;
  secp256k1_gej *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  secp256k1_scalar *in_stack_ffffffffffffff28;
  secp256k1_scalar *in_stack_ffffffffffffff30;
  secp256k1_scalar *in_stack_ffffffffffffff38;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  secp256k1_gej *in_stack_ffffffffffffff48;
  secp256k1_ge *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  secp256k1_pubkey *in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  secp256k1_context *ctx_00;
  int local_4;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 8));
  if (iVar1 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else if (in_RSI == (long *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else if (in_RDX == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else if (in_R9 < (ulong)in_RSI[0x13]) {
    for (ctx_00 = (secp256k1_context *)0x0; ctx_00 < (secp256k1_context *)in_RSI[0x13];
        ctx_00 = (secp256k1_context *)((long)&(ctx_00->ecmult_ctx).pre_g + 1)) {
      if (*(int *)(*in_RSI + (long)ctx_00 * 4) == 0) {
        return 0;
      }
    }
    if (*(int *)(*in_RSI + in_R9 * 4) == 2) {
      secp256k1_ge_set_gej(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      iVar1 = secp256k1_gej_has_quad_y_var(in_stack_ffffffffffffff18);
      if (iVar1 == 0) {
        secp256k1_scalar_negate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        secp256k1_ge_neg(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      secp256k1_fe_normalize((secp256k1_fe *)&stack0xffffffffffffff28);
      secp256k1_compute_prehash
                (ctx_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      iVar1 = secp256k1_compute_sighash
                        ((secp256k1_scalar *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_scalar_set_b32
                  (in_stack_ffffffffffffff10,(uchar *)in_stack_ffffffffffffff08,
                   (int *)in_stack_ffffffffffffff00);
        if (in_stack_ffffffffffffff24 == 0) {
          secp256k1_scalar_mul
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
          secp256k1_scalar_add
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     (secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          secp256k1_scalar_get_b32(in_RDX,(secp256k1_scalar *)&stack0xffffffffffffff80);
          secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff80);
          *(undefined4 *)(*in_RSI + in_R9 * 4) = 3;
          local_4 = 1;
        }
        else {
          secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff80);
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_partial_sign(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, secp256k1_aggsig_partial_signature *partial, const unsigned char *msghash32, const unsigned char *seckey32, size_t index) {
    size_t i;
    secp256k1_scalar sighash;
    secp256k1_scalar sec;
    secp256k1_ge tmp_ge;
    int overflow;
    unsigned char prehash[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(partial != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(index < aggctx->n_sigs);

    /* check state machine */
    for (i = 0; i < aggctx->n_sigs; i++) {
        if (aggctx->progress[i] == NONCE_PROGRESS_UNKNOWN) {
            return 0;
        }
    }
    if (aggctx->progress[index] != NONCE_PROGRESS_OURS) {
        return 0;
    }

    /* sign */
    /* If the total public nonce has wrong sign, negate our
     * secret nonce. Everyone will negate the public one
     * at combine time. */
    secp256k1_ge_set_gej(&tmp_ge, &aggctx->pubnonce_sum);  /* TODO cache this */
    if (!secp256k1_gej_has_quad_y_var(&aggctx->pubnonce_sum)) {
        secp256k1_scalar_negate(&aggctx->secnonce[index], &aggctx->secnonce[index]);
        secp256k1_ge_neg(&tmp_ge, &tmp_ge);
    }
    secp256k1_fe_normalize(&tmp_ge.x);
    secp256k1_compute_prehash(ctx, prehash, aggctx->pubkeys, aggctx->n_sigs, &tmp_ge.x, msghash32);
    if (secp256k1_compute_sighash(&sighash, prehash, index) == 0) {
        return 0;
    }
    secp256k1_scalar_set_b32(&sec, seckey32, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&sec);
        return 0;
    }
    secp256k1_scalar_mul(&sec, &sec, &sighash);
    secp256k1_scalar_add(&sec, &sec, &aggctx->secnonce[index]);

    /* finalize */
    secp256k1_scalar_get_b32(partial->data, &sec);
    secp256k1_scalar_clear(&sec);
    aggctx->progress[index] = NONCE_PROGRESS_SIGNED;
    return 1;
}